

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O2

void __thiscall
t_perl_generator::generate_perl_struct_reader(t_perl_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  pointer pptVar2;
  t_field *tfield;
  ostream *poVar3;
  char *this_00;
  pointer pptVar4;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  poVar3 = std::operator<<(out,"sub read {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_f0);
  poVar3 = std::operator<<(poVar3,"my ($self, $input) = @_;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_d0);
  poVar3 = std::operator<<(poVar3,"my $xfer  = 0;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  poVar3 = std::operator<<(poVar3,"my $fname;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,"my $ftype = 0;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_b0);
  poVar3 = std::operator<<(poVar3,"my $fid   = 0;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"$xfer += $input->readStructBegin(\\$fname);");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"while (1)");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"$xfer += $input->readFieldBegin(\\$fname, \\$ftype, \\$fid);");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"if ($ftype == Thrift::TType::STOP) {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"last;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"SWITCH: for($fid)");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    pptVar2 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    poVar3 = t_generator::indent((t_generator *)this,out);
    if (pptVar4 == pptVar2) break;
    poVar3 = std::operator<<(poVar3,"/^");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(*pptVar4)->key_);
    std::operator<<(poVar3,"$/ && do{");
    poVar3 = t_generator::indent((t_generator *)this,out);
    this_00 = "if ($ftype == ";
    poVar3 = std::operator<<(poVar3,"if ($ftype == ");
    type_to_enum_abi_cxx11_(&local_f0,(t_perl_generator *)this_00,(*pptVar4)->type_);
    poVar3 = std::operator<<(poVar3,(string *)&local_f0);
    poVar3 = std::operator<<(poVar3,") {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_f0);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    tfield = *pptVar4;
    std::__cxx11::string::string((string *)&local_50,"self->",(allocator *)&local_f0);
    generate_deserialize_field(this,out,tfield,&local_50,false);
    std::__cxx11::string::~string((string *)&local_50);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"} else {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"  $xfer += $input->skip($ftype);");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_f0);
    poVar3 = std::operator<<(poVar3,"}");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_d0);
    poVar3 = std::operator<<(poVar3,"last; };");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    pptVar4 = pptVar4 + 1;
  }
  poVar3 = std::operator<<(poVar3,"  $xfer += $input->skip($ftype);");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"$xfer += $input->readFieldEnd();");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"$xfer += $input->readStructEnd();");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"return $xfer;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_f0);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_f0);
  return;
}

Assistant:

void t_perl_generator::generate_perl_struct_reader(ostream& out, t_struct* tstruct) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  out << "sub read {" << endl;

  indent_up();

  out << indent() << "my ($self, $input) = @_;" << endl << indent() << "my $xfer  = 0;" << endl
      << indent() << "my $fname;" << endl << indent() << "my $ftype = 0;" << endl << indent()
      << "my $fid   = 0;" << endl;

  indent(out) << "$xfer += $input->readStructBegin(\\$fname);" << endl;

  // Loop over reading in fields
  indent(out) << "while (1)" << endl;

  scope_up(out);

  indent(out) << "$xfer += $input->readFieldBegin(\\$fname, \\$ftype, \\$fid);" << endl;

  // Check for field STOP marker and break
  indent(out) << "if ($ftype == Thrift::TType::STOP) {" << endl;
  indent_up();
  indent(out) << "last;" << endl;
  indent_down();
  indent(out) << "}" << endl;

  // Switch statement on the field we are reading
  indent(out) << "SWITCH: for($fid)" << endl;

  scope_up(out);

  // Generate deserialization code for known cases
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {

    indent(out) << "/^" << (*f_iter)->get_key() << "$/ && do{";
    indent(out) << "if ($ftype == " << type_to_enum((*f_iter)->get_type()) << ") {" << endl;

    indent_up();
    generate_deserialize_field(out, *f_iter, "self->");
    indent_down();

    indent(out) << "} else {" << endl;

    indent(out) << "  $xfer += $input->skip($ftype);" << endl;

    out << indent() << "}" << endl << indent() << "last; };" << endl;
  }
  // In the default case we skip the field

  indent(out) << "  $xfer += $input->skip($ftype);" << endl;

  scope_down(out);

  indent(out) << "$xfer += $input->readFieldEnd();" << endl;

  scope_down(out);

  indent(out) << "$xfer += $input->readStructEnd();" << endl;

  indent(out) << "return $xfer;" << endl;

  indent_down();
  out << indent() << "}" << endl << endl;
}